

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  InternalRunDeathTestFlag *pIVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  int *piVar6;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  ulong *puVar7;
  __sighandler_t p_Var8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  _union_1457 extraout_RDX_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_01;
  _union_1457 extraout_RDX_02;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  const_iterator __position;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  size_t __len;
  int pipe_fd [2];
  Arguments args;
  int death_test_index;
  ExecDeathTestArgs args_2;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  sigaction ignore_sigprof_action;
  string filter_flag;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f0;
  long local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d0;
  long local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  int local_210;
  int local_20c;
  string local_208;
  int local_1e4;
  string local_1e0;
  long *local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  _union_1457 local_180;
  long local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170 [8];
  _union_1457 local_e8;
  undefined1 local_e0 [8];
  ulong local_d8;
  ulong uStack_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  long local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  UnitTest::GetInstance();
  pIVar1 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_1e4 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar1 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar1->write_fd_;
    return EXECUTE_TEST;
  }
  iVar2 = pipe(&local_210);
  if (iVar2 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar5;
    puVar7 = puVar5 + 2;
    if (local_310 == puVar7) {
      local_300 = *puVar7;
      lStack_2f8 = puVar5[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar7;
    }
    local_308 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar4 + 2);
    if (local_2d0 == paVar14) {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2c0._8_8_ = plVar4[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2c8 = plVar4[1];
    *plVar4 = (long)paVar14;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    local_270._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>(&local_290,(int *)&local_270);
    uVar13 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar13 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_290._M_string_length + local_2c8) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar13 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_290._M_string_length + local_2c8) goto LAB_00126d16;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_00126d16:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar5;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar14) {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar5[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar5[1];
    *puVar5 = paVar14;
    puVar5[1] = 0;
    paVar14->_M_local_buf[0] = '\0';
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_e8.sa_handler = (__sighandler_t)*puVar5;
    p_Var8 = (__sighandler_t)(puVar5 + 2);
    if (local_e8.sa_handler == p_Var8) {
      local_d8 = *(ulong *)p_Var8;
      uStack_d0 = puVar5[3];
      local_e8.sa_handler = (__sighandler_t)&local_d8;
    }
    else {
      local_d8 = *(ulong *)p_Var8;
    }
    local_e0 = (undefined1  [8])puVar5[1];
    *puVar5 = p_Var8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    local_180.sa_handler = (__sighandler_t)*puVar5;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler == paVar9) {
      local_170[0]._0_8_ = paVar9->_M_allocated_capacity;
      local_170[0]._8_8_ = puVar5[3];
      local_180.sa_handler = (__sighandler_t)local_170;
    }
    else {
      local_170[0]._0_8_ = paVar9->_M_allocated_capacity;
    }
    local_178 = puVar5[1];
    *puVar5 = paVar9;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    DeathTestAbort((string *)&local_180);
    puVar5 = extraout_RAX_02;
    local_180 = extraout_RDX_02;
LAB_00127746:
    local_170[0]._0_8_ = paVar9->_M_allocated_capacity;
  }
  else {
    iVar2 = fcntl(local_20c,2,0);
    if (iVar2 != -1) {
      local_2f0 = &local_2e0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = &local_300;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_300 = *puVar7;
        lStack_2f8 = plVar4[3];
      }
      else {
        local_300 = *puVar7;
        local_310 = (ulong *)*plVar4;
      }
      local_308 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = &local_2c0;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar14) {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2c0._8_8_ = plVar4[3];
      }
      else {
        local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4;
      }
      local_2c8 = plVar4[1];
      *plVar4 = (long)paVar14;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar14) {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar4[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_2b0._M_string_length = plVar4[1];
      *plVar4 = (long)paVar14;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
      local_e8.sa_handler = (__sighandler_t)&local_d8;
      p_Var8 = (__sighandler_t)(plVar4 + 2);
      if ((__sighandler_t)*plVar4 == p_Var8) {
        local_d8 = *(ulong *)p_Var8;
        uStack_d0 = plVar4[3];
      }
      else {
        local_d8 = *(ulong *)p_Var8;
        local_e8.sa_handler = (__sighandler_t)*plVar4;
      }
      local_e0 = (undefined1  [8])plVar4[1];
      *plVar4 = (long)p_Var8;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 == paVar14) {
        local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_170[0]._8_8_ = puVar5[3];
        local_180.sa_handler = (__sighandler_t)local_170;
      }
      else {
        local_170[0]._0_8_ = paVar14->_M_allocated_capacity;
        local_180.sa_handler = (__sighandler_t)*puVar5;
      }
      local_178 = puVar5[1];
      *puVar5 = paVar14;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_180);
      paVar14 = &local_40;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar9) {
        local_40._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_40._8_8_ = plVar4[3];
        local_50 = paVar14;
      }
      else {
        local_40._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar4;
      }
      local_48 = plVar4[1];
      *plVar4 = (long)paVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      if (local_e8.sa_handler != (__sighandler_t)&local_d8) {
        operator_delete(local_e8.sa_handler,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"--","");
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_250.field_2._M_allocated_capacity = *puVar7;
        local_250.field_2._8_8_ = plVar4[3];
      }
      else {
        local_250.field_2._M_allocated_capacity = *puVar7;
        local_250._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_250._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_270.field_2._M_allocated_capacity = *puVar7;
        local_270.field_2._8_8_ = plVar4[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar7;
        local_270._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_270._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar7) {
        local_290.field_2._M_allocated_capacity = *puVar7;
        local_290.field_2._8_8_ = plVar4[3];
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar7;
        local_290._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_290._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_290);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 == paVar9) {
        local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2e0._8_8_ = plVar4[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4;
      }
      local_2e8 = plVar4[1];
      *plVar4 = (long)paVar9;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = &local_300;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar7) {
        local_300 = *puVar7;
        lStack_2f8 = plVar4[3];
      }
      else {
        local_300 = *puVar7;
        local_310 = (ulong *)*plVar4;
      }
      local_308 = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      StreamableToString<int>(&local_208,&this->line_);
      uVar12 = 0xf;
      if (local_310 != &local_300) {
        uVar12 = local_300;
      }
      if (uVar12 < local_208._M_string_length + local_308) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != &local_208.field_2) {
          uVar13 = local_208.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_208._M_string_length + local_308) goto LAB_00125851;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,(ulong)local_310);
      }
      else {
LAB_00125851:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_310,(ulong)local_208._M_dataplus._M_p);
      }
      local_2d0 = &local_2c0;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 == paVar9) {
        local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2c0._8_8_ = puVar5[3];
      }
      else {
        local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar5;
      }
      local_2c8 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 == paVar9) {
        local_2b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar5[3];
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2b0._M_dataplus._M_p = (pointer)*puVar5;
      }
      local_2b0._M_string_length = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      StreamableToString<int>(&local_1e0,&local_1e4);
      uVar12 = CONCAT44(local_1e0._M_string_length._4_4_,(int)local_1e0._M_string_length) +
               local_2b0._M_string_length;
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        uVar13 = local_2b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < uVar12) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          uVar13 = local_1e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < uVar12) goto LAB_00125978;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1e0,0,(char *)0x0,(ulong)local_2b0._M_dataplus._M_p);
      }
      else {
LAB_00125978:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2b0,(ulong)local_1e0._M_dataplus._M_p);
      }
      local_e8.sa_handler = (__sighandler_t)&local_d8;
      p_Var8 = (__sighandler_t)(puVar5 + 2);
      if ((__sighandler_t)*puVar5 == p_Var8) {
        local_d8 = *(ulong *)p_Var8;
        uStack_d0 = puVar5[3];
      }
      else {
        local_d8 = *(ulong *)p_Var8;
        local_e8.sa_handler = (__sighandler_t)*puVar5;
      }
      local_e0 = (undefined1  [8])puVar5[1];
      *puVar5 = p_Var8;
      puVar5[1] = 0;
      *p_Var8 = (__sighandler_t)0x0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar5 == paVar9) {
        local_170[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_170[0]._8_8_ = puVar5[3];
        local_180.sa_handler = (__sighandler_t)local_170;
      }
      else {
        local_170[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_180.sa_handler = (__sighandler_t)*puVar5;
      }
      local_178 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      StreamableToString<int>(&local_1a0,&local_20c);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        uVar13 = local_170[0]._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_178 + local_1a0._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
            &local_1a0.field_2) {
          uVar13 = local_1a0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_178 + local_1a0._M_string_length) goto LAB_00125abe;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_180);
      }
      else {
LAB_00125abe:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_180,
                            (ulong)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                            local_1a0._M_dataplus._M_p._0_4_));
      }
      local_1c0 = &local_1b0;
      plVar4 = puVar5 + 2;
      if ((long *)*puVar5 == plVar4) {
        local_1b0 = *plVar4;
        uStack_1a8 = puVar5[3];
      }
      else {
        local_1b0 = *plVar4;
        local_1c0 = (long *)*puVar5;
      }
      local_1b8 = puVar5[1];
      *puVar5 = plVar4;
      puVar5[1] = 0;
      *(undefined1 *)plVar4 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
          &local_1a0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_),
                        local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      if (local_e8.sa_handler != (__sighandler_t)&local_d8) {
        operator_delete(local_e8.sa_handler,local_d8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
        operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
      }
      if (local_2d0 != &local_2c0) {
        operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      if (local_310 != &local_300) {
        operator_delete(local_310,local_300 + 1);
      }
      if (local_2f0 != &local_2e0) {
        operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)&local_208);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_180,__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)&local_208,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_180);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_180);
      __position._M_current = (char **)(local_208._M_string_length - 8);
      local_180.sa_handler = (__sighandler_t)strdup(local_50->_M_local_buf);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,__position,
                 (value_type *)&local_180.sa_handler);
      local_180.sa_handler = (__sighandler_t)strdup((char *)local_1c0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)&local_208,
                 (char **)(local_208._M_string_length - 8),(value_type *)&local_180.sa_handler);
      local_180.sa_handler = (__sighandler_t)local_170;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180.sa_handler != local_170) {
        operator_delete(local_180.sa_handler,local_170[0]._M_allocated_capacity + 1);
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_1e0._M_dataplus._M_p = local_208._M_dataplus._M_p;
      local_1e0._M_string_length._0_4_ = local_210;
      memset(&local_e8,0,0x98);
      sigemptyset((sigset_t *)local_e0);
      local_e8 = (_union_1457)0x1;
      do {
        iVar2 = sigaction(0x1b,(sigaction *)&local_e8,(sigaction *)&local_180);
        if (iVar2 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar2 = fork();
            if (iVar2 == 0) {
              ExecDeathTestChildMain(&local_1e0);
              goto LAB_001265ce;
            }
LAB_00125f97:
            goto LAB_00125f9f;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_001265ce:
            AssumeRole();
          }
          iVar2 = getpagesize();
          __len = (size_t)(iVar2 * 2);
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CHECK failed: File ","");
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
            local_290._M_dataplus._M_p = (pointer)*puVar5;
            puVar7 = puVar5 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar7) {
              local_290.field_2._M_allocated_capacity = *puVar7;
              local_290.field_2._8_8_ = puVar5[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar7;
            }
            local_290._M_string_length = puVar5[1];
            *puVar5 = puVar7;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = &local_2e0;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar5;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar5 + 2);
            if (paVar9 != paVar10) goto LAB_00127046;
            local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2e0._8_8_ = puVar5[3];
            goto LAB_00127053;
          }
          lVar11 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar11 = __len - 0x40;
          }
          if (((uint)(iVar2 * 2) < 0x41) || (((ulong)(lVar11 + (long)__addr) & 0x3f) != 0)) {
            local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_270,"CHECK failed: File ","");
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
            local_290._M_dataplus._M_p = (pointer)*puVar5;
            puVar7 = puVar5 + 2;
            if ((ulong *)local_290._M_dataplus._M_p == puVar7) {
              local_290.field_2._M_allocated_capacity = *puVar7;
              local_290.field_2._8_8_ = puVar5[3];
              local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            }
            else {
              local_290.field_2._M_allocated_capacity = *puVar7;
            }
            local_290._M_string_length = puVar5[1];
            *puVar5 = puVar7;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
            local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar5;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar5 + 2);
            if (local_2f0 == paVar9) {
              local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_2e0._8_8_ = puVar5[3];
              local_2f0 = &local_2e0;
            }
            else {
              local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_2e8 = puVar5[1];
            *puVar5 = paVar9;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            local_230._M_dataplus._M_p._0_4_ = 0x569;
            StreamableToString<int>(&local_250,(int *)&local_230);
            uVar13 = 0xf;
            if (local_2f0 != &local_2e0) {
              uVar13 = local_2e0._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_250._M_string_length + local_2e8) {
              uVar13 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                uVar13 = local_250.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar13 < local_250._M_string_length + local_2e8) goto LAB_00127189;
              puVar5 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
            }
            else {
LAB_00127189:
              puVar5 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
            }
            local_310 = (ulong *)*puVar5;
            puVar7 = puVar5 + 2;
            if (local_310 == puVar7) {
              local_300 = *puVar7;
              lStack_2f8 = puVar5[3];
              local_310 = &local_300;
            }
            else {
              local_300 = *puVar7;
            }
            local_308 = puVar5[1];
            *puVar5 = puVar7;
            puVar5[1] = 0;
            *(undefined1 *)puVar7 = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
            local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar5;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar5 + 2);
            if (local_2d0 == paVar9) {
              local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
              local_2c0._8_8_ = puVar5[3];
              local_2d0 = &local_2c0;
            }
            else {
              local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
            }
            local_2c8 = puVar5[1];
            *puVar5 = paVar9;
            puVar5[1] = 0;
            *(undefined1 *)(puVar5 + 2) = 0;
            puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
            local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar5;
            paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(puVar5 + 2);
            if (paVar9 != paVar10) goto LAB_001278ff;
            local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
            local_2b0.field_2._8_8_ = puVar5[3];
            goto LAB_0012790c;
          }
          iVar2 = clone(ExecDeathTestChildMain,(void *)(lVar11 + (long)__addr),0x11,&local_1e0);
          iVar3 = munmap(__addr,__len);
          if (iVar3 != -1) goto LAB_00125f97;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_270,"CHECK failed: File ","");
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
          local_290._M_dataplus._M_p = (pointer)*puVar5;
          puVar7 = puVar5 + 2;
          if ((ulong *)local_290._M_dataplus._M_p == puVar7) {
            local_290.field_2._M_allocated_capacity = *puVar7;
            local_290.field_2._8_8_ = puVar5[3];
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          }
          else {
            local_290.field_2._M_allocated_capacity = *puVar7;
          }
          local_290._M_string_length = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
          local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar5;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar5 + 2);
          if (local_2f0 == paVar9) {
            local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_2e0._8_8_ = puVar5[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_2e8 = puVar5[1];
          *puVar5 = paVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          local_230._M_dataplus._M_p._0_4_ = 0x56d;
          StreamableToString<int>(&local_250,(int *)&local_230);
          uVar13 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar13 = local_2e0._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_250._M_string_length + local_2e8) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              uVar13 = local_250.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_250._M_string_length + local_2e8) goto LAB_00127232;
            puVar5 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_00127232:
            puVar5 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar5;
          puVar7 = puVar5 + 2;
          if (local_310 == puVar7) {
            local_300 = *puVar7;
            lStack_2f8 = puVar5[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar7;
          }
          local_308 = puVar5[1];
          *puVar5 = puVar7;
          puVar5[1] = 0;
          *(undefined1 *)puVar7 = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar5;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(puVar5 + 2);
          if (local_2d0 == paVar9) {
            local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_2c0._8_8_ = puVar5[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_2c8 = puVar5[1];
          *puVar5 = paVar9;
          puVar5[1] = 0;
          *(undefined1 *)(puVar5 + 2) = 0;
          puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar5;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar5 + 2);
          if (paVar9 != paVar10) goto LAB_0012792d;
          local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
          local_2b0.field_2._8_8_ = puVar5[3];
          goto LAB_0012793a;
        }
        piVar6 = __errno_location();
      } while (*piVar6 == 4);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_250);
      local_270._M_dataplus._M_p = (pointer)*plVar4;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)local_270._M_dataplus._M_p == puVar7) {
        local_270.field_2._M_allocated_capacity = *puVar7;
        local_270.field_2._8_8_ = plVar4[3];
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      }
      else {
        local_270.field_2._M_allocated_capacity = *puVar7;
      }
      local_270._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)*plVar4;
      puVar7 = (ulong *)(plVar4 + 2);
      if ((ulong *)local_290._M_dataplus._M_p == puVar7) {
        local_290.field_2._M_allocated_capacity = *puVar7;
        local_290.field_2._8_8_ = plVar4[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar7;
      }
      local_290._M_string_length = plVar4[1];
      *plVar4 = (long)puVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_1a0._M_dataplus._M_p._0_4_ = 0x54f;
      StreamableToString<int>(&local_230,(int *)&local_1a0);
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar13 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_230._M_string_length + local_290._M_string_length) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          uVar13 = local_230.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_230._M_string_length + local_290._M_string_length)
        goto LAB_00126321;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
      }
      else {
LAB_00126321:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
      }
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if (local_2f0 == paVar9) {
        local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2e0._8_8_ = puVar5[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_2e8 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      paVar9->_M_local_buf[0] = '\0';
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
      local_310 = (ulong *)*puVar5;
      puVar7 = puVar5 + 2;
      if (local_310 == puVar7) {
        local_300 = *puVar7;
        lStack_2f8 = puVar5[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar7;
      }
      local_308 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if (local_2d0 == paVar9) {
        local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2c0._8_8_ = puVar5[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_2c8 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*puVar5;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = puVar5[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2b0._M_string_length = puVar5[1];
      *puVar5 = paVar10;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar5 = extraout_RAX;
      paVar9 = extraout_RDX;
      goto LAB_00126fe1;
    }
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar5;
    puVar7 = puVar5 + 2;
    if (local_310 == puVar7) {
      local_300 = *puVar7;
      lStack_2f8 = puVar5[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar7;
    }
    local_308 = puVar5[1];
    *puVar5 = puVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar5;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if (local_2d0 == paVar14) {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2c0._8_8_ = puVar5[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2c8 = puVar5[1];
    *puVar5 = paVar14;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    local_270._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>(&local_290,(int *)&local_270);
    uVar13 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar13 = local_2c0._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_290._M_string_length + local_2c8) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        uVar13 = local_290.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_290._M_string_length + local_2c8) goto LAB_00126dba;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_00126dba:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,(ulong)local_290._M_dataplus._M_p)
      ;
    }
    local_2b0._M_dataplus._M_p = (pointer)*puVar5;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p == paVar14) {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
      local_2b0.field_2._8_8_ = puVar5[3];
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    }
    else {
      local_2b0.field_2._M_allocated_capacity = paVar14->_M_allocated_capacity;
    }
    local_2b0._M_string_length = puVar5[1];
    *puVar5 = paVar14;
    puVar5[1] = 0;
    paVar14->_M_local_buf[0] = '\0';
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_e8.sa_handler = (__sighandler_t)*puVar5;
    p_Var8 = (__sighandler_t)(puVar5 + 2);
    if (local_e8.sa_handler == p_Var8) {
      local_d8 = *(ulong *)p_Var8;
      uStack_d0 = puVar5[3];
      local_e8.sa_handler = (__sighandler_t)&local_d8;
    }
    else {
      local_d8 = *(ulong *)p_Var8;
    }
    local_e0 = (undefined1  [8])puVar5[1];
    *puVar5 = p_Var8;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
    local_180.sa_handler = (__sighandler_t)*puVar5;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180.sa_handler != paVar9) goto LAB_00127746;
    local_170[0]._0_8_ = paVar9->_M_allocated_capacity;
    local_170[0]._8_8_ = puVar5[3];
    local_180.sa_handler = (__sighandler_t)local_170;
  }
  paVar14 = &local_2c0;
  local_178 = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort((string *)&local_180);
  puVar5 = extraout_RAX_03;
  local_2d0 = extraout_RDX_03;
  goto LAB_0012777d;
LAB_00126036:
  do {
    iVar3 = close(local_20c);
    if (iVar3 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar2;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_210;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_208);
      if (local_1c0 != &local_1b0) {
        operator_delete(local_1c0,local_1b0 + 1);
      }
      if (local_50 != paVar14) {
        operator_delete(local_50,local_40._M_allocated_capacity + 1);
      }
      return OVERSEE_TEST;
    }
    piVar6 = __errno_location();
  } while (*piVar6 == 4);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if (local_2f0 == paVar9) {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2e0._8_8_ = puVar5[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_2e8 = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_310 == puVar7) {
    local_300 = *puVar7;
    lStack_2f8 = plVar4[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar7;
  }
  local_308 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_250._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_270,(int *)&local_250);
  uVar12 = 0xf;
  if (local_310 != &local_300) {
    uVar12 = local_300;
  }
  if (uVar12 < local_270._M_string_length + local_308) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar13 = local_270.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_270._M_string_length + local_308) goto LAB_0012648e;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_0012648e:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_270._M_dataplus._M_p);
  }
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if (local_2d0 == paVar9) {
    local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2c0._8_8_ = puVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_2c8 = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  paVar9->_M_local_buf[0] = '\0';
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar5;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar9) {
    local_2b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar5[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
    local_2b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_e8.sa_handler = (__sighandler_t)*plVar4;
  p_Var8 = (__sighandler_t)(plVar4 + 2);
  if (local_e8.sa_handler == p_Var8) {
    local_d8 = *(ulong *)p_Var8;
    uStack_d0 = plVar4[3];
    local_e8.sa_handler = (__sighandler_t)&local_d8;
  }
  else {
    local_d8 = *(ulong *)p_Var8;
  }
  local_e0 = (undefined1  [8])plVar4[1];
  *plVar4 = (long)p_Var8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_e8);
  local_180.sa_handler = (__sighandler_t)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.sa_handler != paVar10) goto LAB_0012700f;
  local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
  local_170[0]._8_8_ = puVar5[3];
  local_180.sa_handler = (__sighandler_t)local_170;
  goto LAB_00127022;
  while (piVar6 = __errno_location(), *piVar6 == 4) {
LAB_00125f9f:
    iVar3 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)0x0);
    if (iVar3 != -1) {
      if (iVar2 != -1) goto LAB_00126036;
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","")
      ;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
      local_290._M_dataplus._M_p = (pointer)*puVar5;
      puVar7 = puVar5 + 2;
      if ((ulong *)local_290._M_dataplus._M_p == puVar7) {
        local_290.field_2._M_allocated_capacity = *puVar7;
        local_290.field_2._8_8_ = puVar5[3];
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      else {
        local_290.field_2._M_allocated_capacity = *puVar7;
      }
      local_290._M_string_length = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_290);
      local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if (local_2f0 == paVar9) {
        local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2e0._8_8_ = puVar5[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_2e8 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      local_230._M_dataplus._M_p._0_4_ = 0x57d;
      StreamableToString<int>(&local_250,(int *)&local_230);
      uVar13 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar13 = local_2e0._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_250._M_string_length + local_2e8) {
        uVar13 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          uVar13 = local_250.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar13 < local_250._M_string_length + local_2e8) goto LAB_00126fa4;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_00126fa4:
        puVar5 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar5;
      puVar7 = puVar5 + 2;
      if (local_310 == puVar7) {
        local_300 = *puVar7;
        lStack_2f8 = puVar5[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar7;
      }
      local_308 = puVar5[1];
      *puVar5 = puVar7;
      puVar5[1] = 0;
      *(undefined1 *)puVar7 = 0;
      puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar5;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar5 + 2);
      if (local_2d0 == paVar9) {
        local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_2c0._8_8_ = puVar5[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_2c8 = puVar5[1];
      *puVar5 = paVar9;
      puVar5[1] = 0;
      *(undefined1 *)(puVar5 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_2d0);
      local_2b0._M_dataplus._M_p = (pointer)*plVar4;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b0._M_dataplus._M_p == paVar10) {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_2b0.field_2._8_8_ = plVar4[3];
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      }
      else {
        local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
      }
      local_2b0._M_string_length = plVar4[1];
      *plVar4 = (long)paVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      DeathTestAbort(&local_2b0);
      puVar5 = extraout_RAX_04;
      local_2b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_001278d1;
    }
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","");
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_270._M_dataplus._M_p = (pointer)*puVar5;
  puVar7 = puVar5 + 2;
  if ((ulong *)local_270._M_dataplus._M_p == puVar7) {
    local_270.field_2._M_allocated_capacity = *puVar7;
    local_270.field_2._8_8_ = puVar5[3];
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar7;
  }
  local_270._M_string_length = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_290._M_dataplus._M_p = (pointer)*puVar5;
  puVar7 = puVar5 + 2;
  if ((ulong *)local_290._M_dataplus._M_p == puVar7) {
    local_290.field_2._M_allocated_capacity = *puVar7;
    local_290.field_2._8_8_ = puVar5[3];
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  }
  else {
    local_290.field_2._M_allocated_capacity = *puVar7;
  }
  local_290._M_string_length = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_230,(int *)&local_1a0);
  uVar13 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    uVar13 = local_290.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_230._M_string_length + local_290._M_string_length) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      uVar13 = local_230.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_230._M_string_length + local_290._M_string_length) goto LAB_001263e2;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_230,0,(char *)0x0,(ulong)local_290._M_dataplus._M_p);
  }
  else {
LAB_001263e2:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_290,(ulong)local_230._M_dataplus._M_p);
  }
  local_2f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if (local_2f0 == paVar9) {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2e0._8_8_ = puVar5[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_2e8 = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  paVar9->_M_local_buf[0] = '\0';
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_310 == puVar7) {
    local_300 = *puVar7;
    lStack_2f8 = puVar5[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar7;
  }
  local_308 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if (local_2d0 == paVar9) {
    local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2c0._8_8_ = puVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_2c8 = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if (paVar9 == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar5[3];
  }
  else {
LAB_00126fe1:
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0._M_dataplus._M_p = (pointer)paVar9;
  }
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar5 = extraout_RAX_00;
  local_180 = extraout_RDX_00;
LAB_0012700f:
  local_170[0]._0_8_ = paVar10->_M_allocated_capacity;
LAB_00127022:
  local_178 = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort((string *)&local_180);
  puVar5 = extraout_RAX_01;
  paVar9 = extraout_RDX_01;
LAB_00127046:
  local_2e0._M_allocated_capacity = paVar10->_M_allocated_capacity;
  local_2f0 = paVar9;
LAB_00127053:
  local_2e8 = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  local_230._M_dataplus._M_p._0_4_ = 0x55b;
  StreamableToString<int>(&local_250,(int *)&local_230);
  uVar13 = 0xf;
  if (local_2f0 != &local_2e0) {
    uVar13 = local_2e0._M_allocated_capacity;
  }
  if ((ulong)uVar13 < local_250._M_string_length + local_2e8) {
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar13 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_250._M_string_length + local_2e8) goto LAB_001270e0;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_2f0);
  }
  else {
LAB_001270e0:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2f0,(ulong)local_250._M_dataplus._M_p);
  }
  local_310 = (ulong *)*puVar5;
  puVar7 = puVar5 + 2;
  if (local_310 == puVar7) {
    local_300 = *puVar7;
    lStack_2f8 = puVar5[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar7;
  }
  local_308 = puVar5[1];
  *puVar5 = puVar7;
  puVar5[1] = 0;
  *(undefined1 *)puVar7 = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar5;
  paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar5 + 2);
  if (local_2d0 == paVar9) {
    local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
    local_2c0._8_8_ = puVar5[3];
    local_2d0 = &local_2c0;
  }
  else {
LAB_0012777d:
    local_2c0._M_allocated_capacity = paVar9->_M_allocated_capacity;
  }
  local_2c8 = puVar5[1];
  *puVar5 = paVar9;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  puVar5 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0._M_dataplus._M_p = (pointer)*puVar5;
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p == paVar10) {
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
    local_2b0.field_2._8_8_ = puVar5[3];
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
  else {
LAB_001278d1:
    local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar5 = extraout_RAX_05;
  paVar9 = extraout_RDX_05;
LAB_001278ff:
  local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar9;
LAB_0012790c:
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort(&local_2b0);
  puVar5 = extraout_RAX_06;
  paVar9 = extraout_RDX_06;
LAB_0012792d:
  local_2b0.field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  local_2b0._M_dataplus._M_p = (pointer)paVar9;
LAB_0012793a:
  local_2b0._M_string_length = puVar5[1];
  *puVar5 = paVar10;
  puVar5[1] = 0;
  *(undefined1 *)(puVar5 + 2) = 0;
  DeathTestAbort(&local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0._M_allocated_capacity + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)&local_208);
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_50 != paVar14) {
    operator_delete(local_50,local_40._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}